

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O0

long __thiscall
glcts::anon_unknown_0::UniformLocMixWithImplicit2::Run(UniformLocMixWithImplicit2 *this)

{
  long lVar1;
  DefOccurence local_aa0;
  DefOccurence local_a9c;
  LayoutSpecifierBase local_a98;
  LayoutSpecifierBase local_a88;
  UniformType local_a78;
  Uniform local_9e8;
  LayoutSpecifierBase local_810;
  DefOccurence local_800;
  DefOccurence local_7fc;
  LayoutSpecifierBase local_7f8;
  LayoutSpecifierBase local_7e8;
  UniformType local_7d8;
  Uniform local_748;
  LayoutSpecifierBase local_570;
  DefOccurence local_560;
  DefOccurence local_55c;
  LayoutSpecifierBase local_558;
  LayoutSpecifierBase local_548;
  UniformType local_538;
  Uniform local_4a8;
  LayoutSpecifierBase local_2d0;
  DefOccurence local_2c0;
  DefOccurence local_2bc;
  LayoutSpecifierBase local_2b8;
  LayoutSpecifierBase local_2a8;
  UniformType local_290;
  Uniform local_200;
  undefined1 local_28 [8];
  vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  uniforms;
  UniformLocMixWithImplicit2 *this_local;
  
  uniforms.
  super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::
  vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  ::vector((vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
            *)local_28);
  UniformType::UniformType(&local_290,0x1406,3);
  local_2b8 = (LayoutSpecifierBase)
              LayoutSpecifier<glcts::(anonymous_namespace)::LocationSpecifier>::Implicit();
  local_2a8 = local_2b8;
  DefOccurence::DefOccurence(&local_2bc,ALL_SH);
  DefOccurence::DefOccurence(&local_2c0,ALL_SH);
  local_2d0 = local_2a8;
  anon_unknown_0::Uniform::Uniform
            (&local_200,&(this->super_ExplicitUniformLocationCaseBase).uniformValueGenerator,
             &local_290,(Loc)local_2a8,local_2bc,local_2c0);
  std::
  vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  ::push_back((vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
               *)local_28,&local_200);
  anon_unknown_0::Uniform::~Uniform(&local_200);
  UniformType::~UniformType(&local_290);
  UniformType::UniformType(&local_538,0x8b51,2);
  local_558 = (LayoutSpecifierBase)
              LayoutSpecifier<glcts::(anonymous_namespace)::LocationSpecifier>::C(3,Dec);
  local_548 = local_558;
  DefOccurence::DefOccurence(&local_55c,ALL_SH);
  DefOccurence::DefOccurence(&local_560,ALL_SH);
  local_570 = local_548;
  anon_unknown_0::Uniform::Uniform
            (&local_4a8,&(this->super_ExplicitUniformLocationCaseBase).uniformValueGenerator,
             &local_538,(Loc)local_548,local_55c,local_560);
  std::
  vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  ::push_back((vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
               *)local_28,&local_4a8);
  anon_unknown_0::Uniform::~Uniform(&local_4a8);
  UniformType::~UniformType(&local_538);
  UniformType::UniformType(&local_7d8,0x1404,3);
  local_7f8 = (LayoutSpecifierBase)
              LayoutSpecifier<glcts::(anonymous_namespace)::LocationSpecifier>::Implicit();
  local_7e8 = local_7f8;
  DefOccurence::DefOccurence(&local_7fc,ALL_SH);
  DefOccurence::DefOccurence(&local_800,ALL_SH);
  local_810 = local_7e8;
  anon_unknown_0::Uniform::Uniform
            (&local_748,&(this->super_ExplicitUniformLocationCaseBase).uniformValueGenerator,
             &local_7d8,(Loc)local_7e8,local_7fc,local_800);
  std::
  vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  ::push_back((vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
               *)local_28,&local_748);
  anon_unknown_0::Uniform::~Uniform(&local_748);
  UniformType::~UniformType(&local_7d8);
  UniformType::UniformType(&local_a78,0x8b55,2);
  local_a98 = (LayoutSpecifierBase)
              LayoutSpecifier<glcts::(anonymous_namespace)::LocationSpecifier>::C(8,Dec);
  local_a88 = local_a98;
  DefOccurence::DefOccurence(&local_a9c,ALL_SH);
  DefOccurence::DefOccurence(&local_aa0,ALL_SH);
  anon_unknown_0::Uniform::Uniform
            (&local_9e8,&(this->super_ExplicitUniformLocationCaseBase).uniformValueGenerator,
             &local_a78,(Loc)local_a88,local_a9c,local_aa0);
  std::
  vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  ::push_back((vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
               *)local_28,&local_9e8);
  anon_unknown_0::Uniform::~Uniform(&local_9e8);
  UniformType::~UniformType(&local_a78);
  lVar1 = ExplicitUniformLocationCaseBase::doRun
                    (&this->super_ExplicitUniformLocationCaseBase,
                     (vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
                      *)local_28);
  std::
  vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  ::~vector((vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
             *)local_28);
  return lVar1;
}

Assistant:

virtual long Run()
	{
		//uniform float[3] u0;
		//layout (location = 3) uniform vec3[2]  u1;
		//uniform int[3]   u2;
		//layout (location = 8) uniform ivec4   u3;
		std::vector<Uniform> uniforms;
		uniforms.push_back(Uniform(uniformValueGenerator, UniformType(GL_FLOAT, 3), Loc::Implicit()));
		uniforms.push_back(Uniform(uniformValueGenerator, UniformType(GL_FLOAT_VEC3, 2), Loc::C(3)));
		uniforms.push_back(Uniform(uniformValueGenerator, UniformType(GL_INT, 3), Loc::Implicit()));
		uniforms.push_back(Uniform(uniformValueGenerator, UniformType(GL_INT_VEC4, 2), Loc::C(8)));
		return doRun(uniforms);
	}